

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

int Fra_ClassesRefine(Fra_Cla_t *p)

{
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  long *Entry;
  int iVar3;
  int i;
  
  p->vClassesTemp->nSize = 0;
  i = 0;
  iVar3 = 0;
  while( true ) {
    p_00 = p->vClasses;
    if (p_00->nSize <= i) {
      pVVar1 = p->vClassesTemp;
      p->vClassesTemp = p_00;
      p->vClasses = pVVar1;
      return iVar3;
    }
    Entry = (long *)Vec_PtrEntry(p_00,i);
    if (*Entry == 0) break;
    Vec_PtrPush(p->vClassesTemp,Entry);
    iVar2 = Fra_RefineClassLastIter(p,p->vClassesTemp);
    iVar3 = iVar3 + iVar2;
    i = i + 1;
  }
  __assert_fail("pClass[0] != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                ,0x1f8,"int Fra_ClassesRefine(Fra_Cla_t *)");
}

Assistant:

int Fra_ClassesRefine( Fra_Cla_t * p )
{
    Vec_Ptr_t * vTemp;
    Aig_Obj_t ** pClass;
    int i, nRefis;
    // refine the classes
    nRefis = 0;
    Vec_PtrClear( p->vClassesTemp );
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        // add the class to the new array
        assert( pClass[0] != NULL );
        Vec_PtrPush( p->vClassesTemp, pClass );
        // refine the class iteratively
        nRefis += Fra_RefineClassLastIter( p, p->vClassesTemp );
    }
    // exchange the class representation
    vTemp = p->vClassesTemp;
    p->vClassesTemp = p->vClasses;
    p->vClasses = vTemp;
    return nRefis;
}